

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_lshift_safe_in_place(mp_int *r,size_t bits)

{
  byte bVar1;
  BignumInt BVar2;
  ulong uVar3;
  ulong uVar4;
  BignumInt BVar5;
  size_t sVar6;
  size_t local_70;
  size_t i_1;
  BignumInt downshifted_mask;
  size_t no_shift;
  size_t downshift;
  BignumInt w;
  size_t i;
  BignumInt mask;
  size_t word_offset;
  uint bit;
  uint clear;
  size_t bitshift;
  size_t wordshift;
  size_t bits_local;
  mp_int *r_local;
  
  mp_cond_clear(r,(uint)(r->nw - (bits >> 6) >> 0x3f));
  for (bVar1 = 0; r->nw >> (bVar1 & 0x3f) != 0; bVar1 = bVar1 + 1) {
    w = r->nw;
    while (BVar5 = w - 1, w != 0) {
      BVar2 = mp_word(r,BVar5 - (1L << (bVar1 & 0x3f)));
      r->w[BVar5] = (r->w[BVar5] ^ BVar2) & -((bits >> 6) >> (bVar1 & 0x3f) & 1) ^ r->w[BVar5];
      w = BVar5;
    }
  }
  uVar3 = 0x40 - (bits & 0x3f);
  uVar4 = uVar3 >> 6;
  local_70 = r->nw;
  while (sVar6 = local_70 - 1, local_70 != 0) {
    BVar5 = r->w[sVar6];
    BVar2 = mp_word(r,local_70 - 2);
    r->w[sVar6] = BVar5 << (sbyte)(bits & 0x3f) |
                  BVar2 >> ((-(char)uVar4 ^ 0xffU) & (byte)uVar3 & 0x3f) &
                  (-uVar4 ^ 0xffffffffffffffff);
    local_70 = sVar6;
  }
  return;
}

Assistant:

static void mp_lshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    /*
     * Same strategy as mp_rshift_safe_in_place, but of course the
     * other way up.
     */

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = r->nw; i-- > 0 ;) {
            BignumInt w = mp_word(r, i - word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    size_t downshift = BIGNUM_INT_BITS - bitshift;
    size_t no_shift = (downshift >> BIGNUM_INT_BITS_BITS);
    downshift &= ~-(size_t)no_shift;
    BignumInt downshifted_mask = ~-(BignumInt)no_shift;

    for (size_t i = r->nw; i-- > 0 ;) {
        r->w[i] = (r->w[i] << bitshift) |
            ((mp_word(r, i-1) >> downshift) & downshifted_mask);
    }
}